

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialiterable.h
# Opt level: O0

const_iterator __thiscall QSequentialIterable::constBegin(QSequentialIterable *this)

{
  long lVar1;
  void *extraout_RDX;
  QTaggedIterator<QSequentialConstIterator,_void> *in_RSI;
  QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_> in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar2;
  QConstIterator<QMetaSequence> *in_stack_ffffffffffffff98;
  QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
  this_00;
  QIterable<QMetaSequence> *in_stack_ffffffffffffffb8;
  QSequentialConstIterator *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI.m_pointer.d;
  QIterable<QMetaSequence>::constBegin(in_stack_ffffffffffffffb8);
  QSequentialConstIterator::QSequentialConstIterator
            ((QSequentialConstIterator *)this_00.d,in_stack_ffffffffffffff98);
  QTaggedIterator<QSequentialConstIterator,_void>::QTaggedIterator(in_RSI,in_stack_ffffffffffffffc0)
  ;
  QSequentialConstIterator::~QSequentialConstIterator((QSequentialConstIterator *)0x3c1f5d);
  QConstIterator<QMetaSequence>::~QConstIterator((QConstIterator<QMetaSequence> *)0x3c1f67);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
    super_QBaseIterator<QMetaSequence>.m_iterator = extraout_RDX;
    cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
    super_QBaseIterator<QMetaSequence>.m_iterable.m_pointer.d = in_RDI.m_pointer.d;
    return (const_iterator)
           cVar2.super_QSequentialConstIterator.super_QConstIterator<QMetaSequence>.
           super_QBaseIterator<QMetaSequence>;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constBegin() const { return const_iterator(QIterable::constBegin()); }